

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpatialInertia.cpp
# Opt level: O2

Matrix6x6 * __thiscall
iDynTree::SpatialInertia::biasWrenchDerivative
          (Matrix6x6 *__return_storage_ptr__,SpatialInertia *this,Twist *V)

{
  double *pdVar1;
  MatrixBase<Eigen::Product<Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>_>
  *vec;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> mcom;
  Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> angularVel;
  undefined1 local_248 [72];
  Matrix<double,_3,_3,_0,_3,_3> *local_200;
  undefined1 local_1f0 [16];
  XprTypeNested XStack_1e0;
  variable_if_dynamic<long,__1> local_1d0;
  variable_if_dynamic<long,__1> local_1c8;
  Index local_1c0;
  undefined1 local_1b8 [16];
  XprTypeNested local_1a8;
  PointerType pdStack_1a0;
  RhsNested local_198;
  double local_190;
  RhsNested local_188;
  undefined4 uStack_180;
  uint uStack_17c;
  undefined8 local_178;
  Matrix<double,_3,_3,_1,_3,_3> mcCrossOmegaCross;
  RotationalInertia *local_128 [2];
  PointerType local_118;
  undefined2 local_110;
  Matrix<double,_3,_3,_0,_3,_3> local_108;
  undefined1 local_c0 [28];
  uint uStack_a4;
  variable_if_dynamic<long,__1> local_a0;
  variable_if_dynamic<long,__1> vStack_98;
  double local_90;
  undefined4 uStack_88;
  uint uStack_84;
  undefined8 local_80;
  undefined1 local_78 [28];
  uint uStack_5c;
  variable_if_dynamic<long,__1> local_58;
  variable_if_dynamic<long,__1> local_50;
  double local_48;
  undefined4 uStack_40;
  uint uStack_3c;
  undefined8 local_38;
  
  angularVel.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = (PointerType)
           &(V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
            angularVec3;
  mcom.
  super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>.
  m_data = this->m_mcom;
  local_248._40_8_ = this->m_mcom[0];
  local_248._56_4_ = (undefined4)local_248._40_8_;
  local_1b8._0_8_ = local_248;
  local_248._0_8_ = (PointerType)0x0;
  local_248._48_8_ = this->m_mcom[1];
  local_248._24_4_ = *(undefined4 *)(this->m_mcom + 2);
  local_248._28_4_ = *(uint *)((long)this->m_mcom + 0x14) ^ 0x80000000;
  local_248._16_8_ = (ulong)this->m_mcom[1] ^ 0x8000000000000000;
  local_248._32_8_ = 0.0;
  local_248._60_4_ = (uint)((ulong)local_248._40_8_ >> 0x20) ^ 0x80000000;
  local_248._64_8_ = 0.0;
  vStack_98.m_value =
       (long)(V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
             angularVec3.super_Vector3.m_data[0];
  uStack_88 = (undefined4)vStack_98.m_value;
  local_1b8._8_8_ = local_c0;
  local_c0._0_8_ = (PointerType)0x0;
  pdVar1 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           angularVec3.super_Vector3.m_data + 1;
  local_90 = *pdVar1;
  local_c0._24_4_ =
       *(undefined4 *)
        ((V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
         angularVec3.super_Vector3.m_data + 2);
  uStack_a4 = *(uint *)((long)(V->super_SpatialMotionVector).
                              super_SpatialVector<iDynTree::SpatialMotionVector>.angularVec3.
                              super_Vector3.m_data + 0x14) ^ 0x80000000;
  local_c0._16_8_ = (ulong)*pdVar1 ^ 0x8000000000000000;
  local_a0.m_value = 0;
  uStack_84 = (uint)((ulong)vStack_98.m_value >> 0x20) ^ 0x80000000;
  local_80 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&mcCrossOmegaCross,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
              *)local_1b8);
  local_1a8 = (XprTypeNested)this->m_mass;
  pdStack_1a0 = angularVel.
                super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data;
  local_198 = (RhsNested)
              CONCAT62(local_198._2_6_,
                       angularVel.
                       super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       ._8_2_);
  mySkewIn<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
            ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)local_1b8);
  local_a0.m_value = 0;
  vStack_98.m_value = 0;
  local_90 = 2.96439387504748e-323;
  local_c0._0_8_ = __return_storage_ptr__;
  local_c0._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Matrix<double,3,3,0,3,3>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_c0,(Matrix<double,_3,_3,_0,_3,_3> *)local_248);
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       this->m_mass;
  local_108.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       (double)V;
  mySkewIn<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>const>>
            ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
              *)&local_108);
  Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>::
  cross<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((type *)local_1f0,
             (MatrixBase<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>> *)
             &mcom,(MatrixBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
                    *)&angularVel);
  uStack_88 = (undefined4)local_1f0._0_8_;
  local_c0._0_8_ = (PointerType)0x0;
  uStack_a4 = XStack_1e0._4_4_ ^ 0x80000000;
  local_c0._16_8_ = CONCAT44(local_1f0._12_4_,local_1f0._8_4_) ^ 0x8000000000000000;
  local_c0._24_4_ = XStack_1e0._0_4_;
  local_a0.m_value = 0;
  vStack_98.m_value = local_1f0._0_8_;
  uStack_84 = SUB84(local_1f0._0_8_,4) ^ 0x80000000;
  local_80 = 0;
  local_78._0_8_ = __return_storage_ptr__->m_data + 3;
  local_58.m_value = 0;
  local_188.m_matrix = &mcCrossOmegaCross;
  local_50.m_value = 3;
  local_48 = 2.96439387504748e-323;
  local_1a8 = (Matrix<double,_3,_3,_0,_3,_3> *)local_248;
  local_198 = (RhsNested)local_c0;
  local_78._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Matrix<double,3,3,0,3,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,3,1,3,3>>const>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_78,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
              *)local_1b8);
  local_248._0_8_ = __return_storage_ptr__->m_data + 0x12;
  local_248._32_8_ = 1.48219693752374e-323;
  local_248._40_8_ = 0.0;
  local_248._48_8_ = (PointerType)0x6;
  local_248._16_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::Matrix<double,3,3,1,3,3>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_248,&mcCrossOmegaCross);
  vStack_98.m_value =
       (long)*mcom.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
  uStack_88 = (undefined4)vStack_98.m_value;
  local_c0._0_8_ = (PointerType)0x0;
  local_90 = mcom.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[1];
  local_c0._24_4_ =
       *(undefined4 *)
        (mcom.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data + 2);
  uStack_a4 = *(uint *)((long)mcom.
                              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_data + 0x14) ^ 0x80000000;
  local_c0._16_8_ =
       (ulong)mcom.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[1] ^ 0x8000000000000000;
  local_a0.m_value = 0;
  uStack_84 = (uint)((ulong)vStack_98.m_value >> 0x20) ^ 0x80000000;
  local_80 = 0;
  local_190 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
              linearVec3.super_Vector3.m_data[0];
  uStack_180 = SUB84(local_190,0);
  local_1b8._0_8_ = 0;
  pdVar1 = (V->super_SpatialMotionVector).super_SpatialVector<iDynTree::SpatialMotionVector>.
           linearVec3.super_Vector3.m_data + 1;
  local_188.m_matrix = (non_const_type)*pdVar1;
  local_1a8 = (XprTypeNested)((ulong)*pdVar1 ^ 0x8000000000000000);
  pdStack_1a0 = (PointerType)
                ((ulong)(V->super_SpatialMotionVector).
                        super_SpatialVector<iDynTree::SpatialMotionVector>.linearVec3.super_Vector3.
                        m_data[2] ^ 0x8000000000000000);
  local_198 = (RhsNested)0x0;
  uStack_17c = (uint)((ulong)local_190 >> 0x20) ^ 0x80000000;
  local_178 = 0;
  local_50.m_value =
       (long)*angularVel.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
  uStack_40 = (undefined4)local_50.m_value;
  local_78._0_8_ = (PointerType)0x0;
  uStack_3c = (uint)((ulong)local_50.m_value >> 0x20) ^ 0x80000000;
  local_48 = angularVel.
             super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
             .m_data[1];
  local_78._24_4_ =
       *(undefined4 *)
        (angularVel.
         super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
         .m_data + 2);
  uStack_5c = *(uint *)((long)angularVel.
                              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                              .m_data + 0x14) ^ 0x80000000;
  local_78._16_8_ =
       (ulong)angularVel.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data[1] ^ 0x8000000000000000;
  local_58.m_value = 0;
  local_38 = 0;
  local_118 = angularVel.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              .m_data;
  local_110 = angularVel.
              super_MapBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
              ._8_2_;
  local_128[0] = &this->m_rotInertia;
  mySkewIn<Eigen::Product<Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>,0>>
            (&local_108,(iDynTree *)local_128,vec);
  local_1f0._0_8_ = __return_storage_ptr__->m_data + 0x15;
  local_1d0.m_value = 3;
  local_1c8.m_value = 3;
  local_1c0 = 6;
  local_248._16_8_ = (RhsNested)local_c0;
  local_248._32_8_ =
       (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_>
        *)local_1b8;
  local_248._40_8_ =
       (Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
        *)local_78;
  local_248._48_8_ = &this->m_rotInertia;
  local_200 = &local_108;
  XStack_1e0._0_8_ = __return_storage_ptr__;
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Map<Eigen::Matrix<double,6,6,1,6,6>,0,Eigen::Stride<0,0>>,3,3,false>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Matrix<double,3,3,0,3,3>,0>const,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Map<Eigen::Matrix<double,3,3,1,3,3>const,0,Eigen::Stride<0,0>>,0>const>const,Eigen::Matrix<double,3,3,0,3,3>const>>
            ((Block<Eigen::Map<Eigen::Matrix<double,_6,_6,_1,_6,_6>,_0,_Eigen::Stride<0,_0>_>,_3,_3,_false>
              *)local_1f0,
             (CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Map<const_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0,_Eigen::Stride<0,_0>_>,_0>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>
              *)local_248);
  return __return_storage_ptr__;
}

Assistant:

Matrix6x6 SpatialInertia::biasWrenchDerivative(const Twist& V) const
{
    Matrix6x6 ret;

    Eigen::Map<const Eigen::Vector3d> linearVel(V.getLinearVec3().data());
    Eigen::Map<const Eigen::Vector3d> angularVel(V.getAngularVec3().data());

    Eigen::Map< Eigen::Matrix<double,6,6,Eigen::RowMajor> > retEigen(ret.data());

    Eigen::Map<const Eigen::Vector3d> mcom(this->m_mcom);
    Eigen::Map<const Eigen::Matrix<double,3,3,Eigen::RowMajor> > I(this->m_rotInertia.data());

    Eigen::Matrix<double,3,3,Eigen::RowMajor> mcCrossOmegaCross = mySkewIn(mcom)*mySkewIn(angularVel);
    retEigen.block<3,3>(0,0) = mySkewIn(this->m_mass*angularVel);
    retEigen.block<3,3>(0,3) = -mySkewIn(this->m_mass*linearVel) + mySkewIn(mcom.cross(angularVel)) - mcCrossOmegaCross.transpose();
    retEigen.block<3,3>(3,0) = mcCrossOmegaCross;
    retEigen.block<3,3>(3,3) = -mySkewIn(mcom)*mySkewIn(linearVel) + mySkewIn(angularVel)*I - mySkewIn(I*angularVel);

    return ret;
}